

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  Inst *this_00;
  int i;
  pointer piVar1;
  pointer pvVar2;
  int *piVar3;
  bool bVar4;
  int *piVar5;
  int *piVar6;
  uint i_00;
  int root_local;
  int local_48;
  int local_44;
  SparseArray<int> *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  uint32_t uVar7;
  
  reachable->size_ = 0;
  piVar1 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  root_local = root;
  local_40 = predmap;
  local_38 = predvec;
  std::vector<int,_std::allocator<int>_>::push_back(stk,&root_local);
  do {
    piVar1 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar1) {
      piVar5 = (reachable->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
               ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      for (piVar6 = piVar5; piVar6 != piVar5 + reachable->size_; piVar6 = piVar6 + 1) {
        i = *piVar6;
        bVar4 = SparseArray<int>::has_index(local_40,i);
        if (bVar4) {
          piVar5 = SparseArray<int>::get_existing(local_40,i);
          pvVar2 = (local_38->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar3 = *(pointer *)
                    ((long)&pvVar2[*piVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          for (piVar5 = pvVar2[*piVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
            bVar4 = SparseSetT<void>::contains(reachable,*piVar5);
            if (!bVar4) {
              bVar4 = SparseArray<int>::has_index(rootmap,i);
              if (!bVar4) {
                local_48 = rootmap->size_;
                SparseArray<int>::set_new(rootmap,i,&local_48);
              }
            }
          }
        }
        piVar5 = (reachable->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
      }
      return;
    }
    i_00 = piVar1[-1];
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1 + -1;
    while( true ) {
      bVar4 = SparseSetT<void>::contains(reachable,i_00);
      if (bVar4) break;
      SparseSetT<void>::insert_new(reachable,i_00);
      if (i_00 != root_local) {
        bVar4 = SparseArray<int>::has_index(rootmap,i_00);
        if (bVar4) break;
      }
      this_00 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + (int)i_00;
      uVar7 = this_00->out_opcode_;
      if ((3U >> (uVar7 & 7) & 1) == 0) {
        if ((uVar7 & 7) != 6) break;
      }
      else {
        local_44 = Inst::out1(this_00);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(stk,&local_44);
        uVar7 = this_00->out_opcode_;
      }
      i_00 = uVar7 >> 4;
    }
  } while( true );
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}